

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O2

file_info * heap_get_entry(heap_queue *heap)

{
  file_info **ppfVar1;
  file_info *pfVar2;
  ulong uVar3;
  file_info *pfVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  
  if (heap->used < 1) {
    return (file_info *)0x0;
  }
  ppfVar1 = heap->files;
  pfVar2 = *ppfVar1;
  uVar5 = heap->used - 1;
  heap->used = uVar5;
  *ppfVar1 = ppfVar1[uVar5];
  uVar3 = (*heap->files)->key;
  iVar6 = 0;
  while( true ) {
    iVar7 = iVar6 * 2 + 1;
    if ((int)uVar5 <= iVar7) {
      return pfVar2;
    }
    ppfVar1 = heap->files;
    uVar8 = ppfVar1[iVar7]->key;
    iVar9 = iVar6 * 2 + 2;
    if ((iVar9 < (int)uVar5) && (ppfVar1[iVar9]->key < uVar8)) {
      uVar8 = ppfVar1[iVar9]->key;
      iVar7 = iVar9;
    }
    if (uVar3 <= uVar8) break;
    pfVar4 = ppfVar1[iVar6];
    ppfVar1[iVar6] = ppfVar1[iVar7];
    heap->files[iVar7] = pfVar4;
    iVar6 = iVar7;
  }
  return pfVar2;
}

Assistant:

static struct file_info *
heap_get_entry(struct heap_queue *heap)
{
	uint64_t a_key, b_key, c_key;
	int a, b, c;
	struct file_info *r, *tmp;

	if (heap->used < 1)
		return (NULL);

	/*
	 * The first file in the list is the earliest; we'll return this.
	 */
	r = heap->files[0];

	/*
	 * Move the last item in the heap to the root of the tree
	 */
	heap->files[0] = heap->files[--(heap->used)];

	/*
	 * Rebalance the heap.
	 */
	a = 0; /* Starting element and its heap key */
	a_key = heap->files[a]->key;
	for (;;) {
		b = a + a + 1; /* First child */
		if (b >= heap->used)
			return (r);
		b_key = heap->files[b]->key;
		c = b + 1; /* Use second child if it is smaller. */
		if (c < heap->used) {
			c_key = heap->files[c]->key;
			if (c_key < b_key) {
				b = c;
				b_key = c_key;
			}
		}
		if (a_key <= b_key)
			return (r);
		tmp = heap->files[a];
		heap->files[a] = heap->files[b];
		heap->files[b] = tmp;
		a = b;
	}
}